

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_ImageSectionStream.cpp
# Opt level: O3

uint32_t __thiscall
PDB::ImageSectionStream::ConvertSectionOffsetToRVA
          (ImageSectionStream *this,uint16_t oneBasedSectionIndex,uint32_t offsetInSection)

{
  uint32_t uVar1;
  undefined2 in_register_00000032;
  uint uVar2;
  
  uVar2 = CONCAT22(in_register_00000032,oneBasedSectionIndex);
  uVar1 = 0;
  if ((uVar2 != 0) && (uVar1 = 0, (ulong)uVar2 <= this->m_count)) {
    uVar1 = offsetInSection + this->m_headers[uVar2 - 1].VirtualAddress;
  }
  return uVar1;
}

Assistant:

PDB_NO_DISCARD uint32_t PDB::ImageSectionStream::ConvertSectionOffsetToRVA(uint16_t oneBasedSectionIndex, uint32_t offsetInSection) const PDB_NO_EXCEPT
{
	if (oneBasedSectionIndex == 0u)
	{
		// should never happen, but prevent underflow
		return 0u;
	}
	else if (oneBasedSectionIndex > m_count)
	{
		// this symbol is "contained" in a section that is neither part of the PDB, nor the EXE.
		// it is a special compiler-generated or linker-generated symbol such as CFG symbols (e.g. __guard_fids_count, __guard_flags).
		// we can safely ignore those symbols.
		return 0u;
	}

	return m_headers[oneBasedSectionIndex - 1u].VirtualAddress + offsetInSection;
}